

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O0

xml_node<char> * __thiscall
rapidxml::xml_document<char>::parse_xml_declaration<0>(xml_document<char> *this,char **text)

{
  parse_error *this_00;
  bool bVar1;
  char **text_local;
  xml_document<char> *this_local;
  
  while( true ) {
    bVar1 = true;
    if (**text == '?') {
      bVar1 = (*text)[1] != '>';
    }
    if (!bVar1) break;
    if (**text == '\0') {
      this_00 = (parse_error *)__cxa_allocate_exception(0x18);
      parse_error::parse_error(this_00,"unexpected end of data",*text);
      __cxa_throw(this_00,&parse_error::typeinfo,parse_error::~parse_error);
    }
    *text = *text + 1;
  }
  *text = *text + 2;
  return (xml_node<char> *)0x0;
}

Assistant:

xml_node<Ch> *parse_xml_declaration(Ch *&text)
        {
            // If parsing of declaration is disabled
            if (!(Flags & parse_declaration_node))
            {
                // Skip until end of declaration
                while (text[0] != Ch('?') || text[1] != Ch('>'))
                {
                    if (!text[0])
                        RAPIDXML_PARSE_ERROR("unexpected end of data", text);
                    ++text;
                }
                text += 2;    // Skip '?>'
                return 0;
            }

            // Create declaration
            xml_node<Ch> *declaration = this->allocate_node(node_declaration);

            // Skip whitespace before attributes or ?>
            skip<whitespace_pred, Flags>(text);

            // Parse declaration attributes
            parse_node_attributes<Flags>(text, declaration);

            // Skip ?>
            if (text[0] != Ch('?') || text[1] != Ch('>'))
                RAPIDXML_PARSE_ERROR("expected ?>", text);
            text += 2;

            return declaration;
        }